

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.cc
# Opt level: O0

ostream * testing::operator<<(ostream *os,TestPartResult *result)

{
  int iVar1;
  Type TVar2;
  char *pcVar3;
  ostream *poVar4;
  char *local_38;
  TestPartResult *result_local;
  ostream *os_local;
  
  pcVar3 = TestPartResult::file_name(result);
  poVar4 = std::operator<<(os,pcVar3);
  poVar4 = std::operator<<(poVar4,":");
  iVar1 = TestPartResult::line_number(result);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
  poVar4 = std::operator<<(poVar4,": ");
  TVar2 = TestPartResult::type(result);
  if (TVar2 == kSuccess) {
    local_38 = "Success";
  }
  else {
    TVar2 = TestPartResult::type(result);
    local_38 = "Non-fatal failure";
    if (TVar2 == kFatalFailure) {
      local_38 = "Fatal failure";
    }
  }
  poVar4 = std::operator<<(poVar4,local_38);
  poVar4 = std::operator<<(poVar4,":\n");
  pcVar3 = TestPartResult::message(result);
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  return poVar4;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const TestPartResult& result) {
  return os
      << result.file_name() << ":" << result.line_number() << ": "
      << (result.type() == TestPartResult::kSuccess ? "Success" :
          result.type() == TestPartResult::kFatalFailure ? "Fatal failure" :
          "Non-fatal failure") << ":\n"
      << result.message() << std::endl;
}